

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

Bool ParseCSS1Selector(TidyDocImpl *doc,TidyOptionImpl *option)

{
  StreamIn *in;
  long lVar1;
  ulong uVar2;
  tchar c;
  Bool BVar3;
  long lVar4;
  ulong uVar5;
  ctmbstr val;
  TidyOptionId optId;
  tmbchar *ptVar6;
  char buf [256];
  tmbchar local_138 [264];
  
  val = local_138;
  memset(local_138,0,0x100);
  if ((doc->config).c == 0xffffffff) {
    optId = option->id;
    val = (ctmbstr)0x0;
  }
  else {
    c = SkipWhite(&doc->config);
    if (c == 0xffffffff) {
      return no;
    }
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      lVar4 = lVar1;
      BVar3 = prvTidyIsWhite(c);
      if (BVar3 != no) {
        local_138[uVar5] = '\0';
        if (lVar4 == 0) {
          return no;
        }
        ptVar6 = local_138 + -lVar4;
        goto LAB_00155b83;
      }
      local_138[uVar5] = (tmbchar)c;
      if ((doc->config).c == 0xffffffff) break;
      in = (doc->config).cfgIn;
      if (in == (StreamIn *)0x0) {
        (doc->config).c = 0xffffffff;
        break;
      }
      c = prvTidyReadChar(in);
      (doc->config).c = c;
      if (0xfc < uVar5) break;
      lVar1 = lVar4 + -1;
      uVar2 = uVar5 + 1;
    } while (c != 0xffffffff);
    ptVar6 = local_138 + (1 - lVar4);
    local_138[uVar5 + 1] = '\0';
LAB_00155b83:
    BVar3 = prvTidyIsCSS1Selector(local_138);
    if (BVar3 == no) {
      prvTidyReportBadArgument(doc,option->name);
      return no;
    }
    *ptVar6 = '\0';
    optId = option->id;
  }
  SetOptionValue(doc,optId,val);
  return yes;
}

Assistant:

Bool ParseCSS1Selector( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    char buf[256] = {0};
    uint i = 0;
    uint c;

    /* Given an empty string, so signal success. */
    if ( cfg->c == EndOfStream )
    {
        SetOptionValue( doc, option->id, NULL );
        return yes;
    }

    c = SkipWhite( cfg );

    while ( i < sizeof(buf)-2 && c != EndOfStream && !TY_(IsWhite)(c) )
    {
        buf[i++] = (tmbchar) c;
        c = AdvanceChar( &doc->config );
    }
    buf[i] = '\0';

    if ( i == 0 ) {
        return no;
    }
    else if ( !TY_(IsCSS1Selector)(buf) ) {
        TY_(ReportBadArgument)( doc, option->name );
        return no;
    }

    buf[i] = 0; /* Is #697 - Do *not* add '-' */
#if 0   /* Is #697 - Is this still required? KEEP HISTORY - DO NOT DELETE */
    buf[i++] = '-';  /* Make sure any escaped Unicode is terminated */
    buf[i] = 0;      /* so valid class names are generated after */
                     /* Tidy appends last digits. */
#endif /* Is #697 - Is this still required? */

    SetOptionValue( doc, option->id, buf );
    return yes;
}